

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,pbrt::RenderingCoordinateSystem_const&,int_const&,pbrt::LogLevel_const&,std::__cxx11::string_const&,bool_const&,bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
               (string *s,char *fmt,bool *v,bool *args,bool *args_1,bool *args_2,bool *args_3,
               bool *args_4,bool *args_5,bool *args_6,bool *args_7,RenderingCoordinateSystem *args_8
               ,int *args_9,LogLevel *args_10,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_11,
               bool *args_12,bool *args_13,bool *args_14,bool *args_15,optional<int> *args_16,
               optional<int> *args_17,bool *args_18,bool *args_19,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_20,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_21,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_22,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_23,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_24,
               optional<pbrt::Bounds2<float>_> *args_25,optional<pbrt::Bounds2<int>_> *args_26,
               optional<pbrt::Point2<int>_> *args_27,float *args_28)

{
  long lVar1;
  ulong uVar2;
  byte *in_RDX;
  bool *unaff_RBP;
  char *pcVar3;
  string *in_RDI;
  string *in_R9;
  bool *unaff_R13;
  bool *unaff_R14;
  bool *unaff_R15;
  byte bVar4;
  byte bVar5;
  undefined1 uVar6;
  RenderingCoordinateSystem *unaff_retaddr;
  bool *in_stack_00000008;
  bool *in_stack_00000010;
  string *in_stack_00000018;
  bool *in_stack_00000020;
  string *in_stack_00000028;
  bool *in_stack_00000030;
  bool *in_stack_00000038;
  optional<int> *in_stack_00000040;
  optional<int> *in_stack_00000048;
  bool *in_stack_00000050;
  bool *in_stack_00000058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000080;
  optional<pbrt::Bounds2<float>_> *in_stack_00000088;
  optional<pbrt::Bounds2<int>_> *in_stack_00000090;
  optional<pbrt::Point2<int>_> *in_stack_00000098;
  float *in_stack_000000a0;
  optional<int> *in_stack_000000a8;
  optional<int> *in_stack_000000b0;
  bool *in_stack_000000b8;
  bool *in_stack_000000c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000d0;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffb60;
  char **in_stack_fffffffffffffb68;
  char **in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  char *in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  int line;
  char *in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  LogLevel level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  optional<pbrt::Bounds2<float>_> *in_stack_fffffffffffffc28;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffc30;
  optional<pbrt::Point2<int>_> *in_stack_fffffffffffffc38;
  float *in_stack_fffffffffffffc40;
  string local_2a8 [32];
  string local_288 [32];
  undefined8 local_268;
  string local_260 [32];
  stringstream local_240 [16];
  undefined1 local_230 [376];
  string local_b8 [32];
  undefined4 local_98;
  undefined5 in_stack_ffffffffffffff78;
  bool *in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  bool *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffc00 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
  copyToFormatString(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x2a);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x73);
  bVar5 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,100);
  uVar6 = lVar1 != -1;
  if ((bVar4 & 1) == 0) {
    if ((bVar5 & 1) == 0) {
      if ((bool)uVar6) {
        uVar2 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)&stack0xffffffffffffff80,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffb78,(bool *)in_stack_fffffffffffffb70);
        std::__cxx11::string::operator+=(in_RDI,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      else if ((bVar5 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(level,in_stack_fffffffffffffbf8,line,in_stack_fffffffffffffbe8);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffb78,(bool *)in_stack_fffffffffffffb70);
        std::__cxx11::string::operator+=(in_RDI,local_2a8);
        std::__cxx11::string::~string(local_2a8);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_240);
        std::ostream::operator<<(local_230,(bool)(*in_RDX & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_268 = std::__cxx11::string::c_str();
        formatOne<char_const*>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        std::__cxx11::string::operator+=(in_RDI,local_260);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::stringstream::~stringstream(local_240);
      }
    }
    else {
      pcVar3 = "false";
      if ((*in_RDX & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,pbrt::RenderingCoordinateSystem_const&,int_const&,pbrt::LogLevel_const&,std::__cxx11::string_const&,bool_const&,bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
              (in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,
               (bool *)CONCAT17(bVar4,CONCAT16(bVar5,CONCAT15(uVar6,in_stack_ffffffffffffff78))),
               unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,(int *)in_stack_00000008,
               (LogLevel *)in_stack_00000010,in_stack_00000018,in_stack_00000020,
               (bool *)in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
               in_stack_00000048,in_stack_00000050,in_stack_00000058,in_stack_00000060,
               in_stack_00000068,in_stack_00000070,in_stack_00000078,in_stack_00000080,
               in_stack_00000088,in_stack_00000090,in_stack_00000098,in_stack_000000a0);
    local_98 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,pbrt::RenderingCoordinateSystem_const&,int_const&,pbrt::LogLevel_const&,std::__cxx11::string_const&,bool_const&,bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
               in_stack_00000008,(bool *)in_R9,in_stack_00000038,(bool *)in_stack_00000040,
               (bool *)in_stack_00000048,in_stack_00000050,in_stack_00000058,
               (bool *)in_stack_00000060,(RenderingCoordinateSystem *)in_stack_00000068,
               (int *)in_stack_00000070,(LogLevel *)in_stack_00000078,in_stack_00000080,
               (bool *)in_stack_00000088,(bool *)in_stack_00000090,(bool *)in_stack_00000098,
               (bool *)in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,in_stack_000000b8,
               in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28,
               in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,in_stack_fffffffffffffc40);
    local_98 = 1;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}